

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# defineCallOpen.hh
# Opt level: O0

shared_ptr<discordpp::BotStruct::Call> __thiscall discordpp::BotStruct::Call::run(Call *this)

{
  long *plVar1;
  long in_RSI;
  shared_ptr<discordpp::BotStruct::RenderedCall> sVar2;
  shared_ptr<discordpp::BotStruct::Call> sVar3;
  Call *this_local;
  
  plVar1 = *(long **)(in_RSI + 0x18);
  this_local = this;
  sVar2 = render((Call *)&stack0xffffffffffffffd8);
  (**(code **)(*plVar1 + 0x38))
            (plVar1,(Call *)&stack0xffffffffffffffd8,
             sVar2.
             super___shared_ptr<discordpp::BotStruct::RenderedCall,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi._M_pi);
  std::shared_ptr<discordpp::BotStruct::RenderedCall>::~shared_ptr
            ((shared_ptr<discordpp::BotStruct::RenderedCall> *)&stack0xffffffffffffffd8);
  sVar3 = std::enable_shared_from_this<discordpp::BotStruct::Call>::shared_from_this
                    ((enable_shared_from_this<discordpp::BotStruct::Call> *)this);
  sVar3.super___shared_ptr<discordpp::BotStruct::Call,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<discordpp::BotStruct::Call>)
         sVar3.super___shared_ptr<discordpp::BotStruct::Call,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

auto run() {
        bot_->doCall(render());
        return shared_from_this();
    }